

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O1

void __thiscall
qclab::qgates::RotationY<float>::RotationY
          (RotationY<float> *this,int qubit,real_type cos,real_type sin,bool fixed)

{
  (this->super_QRotationGate1<float>).super_QGate1<float>.super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0013b018;
  (this->super_QRotationGate1<float>).super_QGate1<float>.qubit_ = qubit;
  if (-1 < qubit) {
    (this->super_QRotationGate1<float>).super_QGate1<float>.field_0xc = fixed;
    (this->super_QRotationGate1<float>).rotation_.angle_.cos_ = cos;
    (this->super_QRotationGate1<float>).rotation_.angle_.sin_ = sin;
    (this->super_QRotationGate1<float>).super_QGate1<float>.super_QObject<float>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_0013b538;
    return;
  }
  __assert_fail("qubit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                ,0x21,"qclab::qgates::QGate1<float>::QGate1(const int) [T = float]");
}

Assistant:

QGate1( const int qubit )
        : qubit_( qubit )
        {
          assert( qubit >= 0 ) ;
        }